

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall
Model_replaceImportedUnitsByName_Test::TestBody(Model_replaceImportedUnitsByName_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr model;
  ImportSourcePtr import2;
  UnitsPtr myImportedUnits2;
  UnitsPtr myImportedUnits1;
  ImportSourcePtr import1;
  UnitsPtr myConcreteUnits2;
  UnitsPtr myConcreteUnits1;
  long *local_c0;
  long *local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertionResult local_a8;
  long local_98 [2];
  AssertHelper local_88 [8];
  shared_ptr *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myConcreteUnits1","");
  libcellml::Units::create(local_20);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myImportedUnits1","");
  libcellml::Units::create((string *)&local_50);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myConcreteUnits2","");
  libcellml::Units::create(local_30);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myImportedUnits2","");
  libcellml::Units::create((string *)&local_60);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::ImportSource::create();
  libcellml::ImportSource::create();
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"import1.cellml","");
  libcellml::ImportSource::setUrl(local_40);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"import2.cellml","");
  libcellml::ImportSource::setUrl(local_70);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_50 + 0x10));
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_60 + 0x10));
  libcellml::Model::addUnits(local_80);
  libcellml::Model::addUnits(local_80);
  local_b8 = (long *)0x2;
  local_c0 = (long *)libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(2)","model->unitsCount()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_c0);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x390,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (((local_b8 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_b8 != (long *)0x0)) {
      (**(code **)(*local_b8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  psVar1 = local_80;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myConcreteUnits1","");
  cVar2 = libcellml::Model::replaceUnits((string *)psVar1,(shared_ptr *)&local_a8);
  local_b8 = (long *)CONCAT71(local_b8._1_7_,cVar2);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_a8._0_8_ == local_98) {
    if (cVar2 == '\0') goto LAB_00120eb3;
  }
  else {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    if (((ulong)local_b8 & 1) == 0) {
LAB_00120eb3:
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(char *)&local_b8,
                 "model->replaceUnits(\"myConcreteUnits1\", myImportedUnits1)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
                 ,0x393,(char *)local_a8._0_8_);
      testing::internal::AssertHelper::operator=(local_88,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(local_88);
      if ((long *)local_a8._0_8_ != local_98) {
        operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
      }
      if (((local_c0 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8 = (long *)0x2;
  local_c0 = (long *)libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(2)","model->unitsCount()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_c0);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x394,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (((local_b8 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_b8 != (long *)0x0)) {
      (**(code **)(*local_b8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myImportedUnits2","");
  cVar2 = libcellml::Model::replaceUnits((string *)local_80,(shared_ptr *)&local_a8);
  local_b8 = (long *)CONCAT71(local_b8._1_7_,cVar2);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_a8._0_8_ == local_98) {
    if (cVar2 != '\0') goto LAB_00121139;
  }
  else {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    if (((ulong)local_b8 & 1) != 0) goto LAB_00121139;
  }
  testing::Message::Message((Message *)&local_c0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_a8,(char *)&local_b8,
             "model->replaceUnits(\"myImportedUnits2\", myConcreteUnits2)","false");
  testing::internal::AssertHelper::AssertHelper
            (local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
             ,0x397,(char *)local_a8._0_8_);
  testing::internal::AssertHelper::operator=(local_88,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper(local_88);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (((local_c0 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_c0 != (long *)0x0)) {
    (**(code **)(*local_c0 + 8))();
  }
LAB_00121139:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8 = (long *)0x2;
  local_c0 = (long *)libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(2)","model->unitsCount()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_c0);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x398,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (((local_b8 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_b8 != (long *)0x0)) {
      (**(code **)(*local_b8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  return;
}

Assistant:

TEST(Model, replaceImportedUnitsByName)
{
    auto model = libcellml::Model::create();
    auto myConcreteUnits1 = libcellml::Units::create("myConcreteUnits1");
    auto myImportedUnits1 = libcellml::Units::create("myImportedUnits1");
    auto myConcreteUnits2 = libcellml::Units::create("myConcreteUnits2");
    auto myImportedUnits2 = libcellml::Units::create("myImportedUnits2");

    auto import1 = libcellml::ImportSource::create();
    auto import2 = libcellml::ImportSource::create();

    import1->setUrl("import1.cellml");
    import2->setUrl("import2.cellml");

    myImportedUnits1->setImportSource(import1);
    myImportedUnits2->setImportSource(import2);

    model->addUnits(myConcreteUnits1);
    model->addUnits(myImportedUnits2);

    EXPECT_EQ(size_t(2), model->unitsCount());

    // REPLACE concrete -> imported by name.
    EXPECT_TRUE(model->replaceUnits("myConcreteUnits1", myImportedUnits1));
    EXPECT_EQ(size_t(2), model->unitsCount());

    // REPLACE imported -> concrete by name.
    EXPECT_TRUE(model->replaceUnits("myImportedUnits2", myConcreteUnits2));
    EXPECT_EQ(size_t(2), model->unitsCount());
}